

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall cppcms::widgets::select_base::element::element(element *this)

{
  *(byte *)this = *(byte *)this & 0xfe;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->str_option)._M_dataplus._M_p = (pointer)&(this->str_option).field_2;
  (this->str_option)._M_string_length = 0;
  (this->str_option).field_2._M_local_buf[0] = '\0';
  booster::locale::basic_message<char>::basic_message(&this->tr_option);
  (this->d).ptr_ = (_data *)0x0;
  return;
}

Assistant:

select_base::element::element() : need_translation(0)
{
}